

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-parser.h
# Opt level: O1

int ORPG::Core::getopt_long(int argc,char **argv,char *optstring,option *longopts,int *index)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  option *poVar7;
  char *__s2;
  char *__s;
  int iVar8;
  char *local_60;
  
  iVar2 = -1;
  if (optstring != (char *)0x0) {
    if (optind == 0) {
      optreset = 1;
      optind = 1;
    }
    iVar2 = getopt_internal(argc,argv,optstring);
    iVar1 = optind;
    if (iVar2 == -2) {
      lVar6 = (long)optind;
      optind = optind + 1;
      iVar2 = -1;
      if (argv[lVar6][2] != '\0') {
        __s = argv[lVar6] + 2;
        local_60 = strchr(__s,0x3d);
        if (local_60 == (char *)0x0) {
          sVar5 = strlen(__s);
          uVar3 = (uint)sVar5;
          local_60 = (char *)0x0;
        }
        else {
          uVar3 = (int)local_60 - (int)__s;
          local_60 = local_60 + 1;
        }
        __s2 = longopts->name;
        if (__s2 == (char *)0x0) {
          iVar4 = -1;
        }
        else {
          poVar7 = longopts + 1;
          iVar2 = -1;
          iVar8 = 0;
          do {
            iVar4 = strncmp(__s,__s2,(long)(int)uVar3);
            if (iVar4 == 0) {
              sVar5 = strlen(__s2);
              iVar4 = iVar8;
              if (sVar5 == uVar3) break;
              if (iVar2 == -1) {
                iVar2 = iVar8;
              }
            }
            __s2 = poVar7->name;
            iVar8 = iVar8 + 1;
            poVar7 = poVar7 + 1;
            iVar4 = iVar2;
          } while (__s2 != (char *)0x0);
        }
        if (iVar4 == -1) {
          iVar2 = 0x3f;
          if ((opterr != 0) && (*optstring != ':')) {
            getopt_long();
          }
        }
        else {
          if ((longopts[iVar4].has_arg - 1U < 2) && (optarg = local_60, local_60 == (char *)0x0)) {
            optind = iVar1 + 2;
            optarg = argv[lVar6 + 1];
          }
          if ((longopts[iVar4].has_arg == 1) && (optarg == (char *)0x0)) {
            if ((opterr != 0) && (*optstring != ':')) {
              getopt_long();
            }
            iVar2 = (uint)(*optstring != ':') * 5 + 0x3a;
          }
          else {
            iVar2 = longopts[iVar4].val;
            if (longopts[iVar4].flag != (int *)0x0) {
              *longopts[iVar4].flag = iVar2;
              iVar2 = 0;
            }
            if (index != (int *)0x0) {
              *index = iVar4;
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int getopt_long(int argc, char* argv[],
                        const char* optstring,
                        const struct option* longopts,
                        int* index) {
            if(optstring == NULL)
                return EOF;

            /* lets make sure we don't
            check the program name */
            if(optind == 0)
                optind = optreset = 1;

            int retval = EOF;

            if ((retval = getopt_internal(argc, argv, optstring)) == CONTINUE_CODE) {
                char *current_argv = argv[optind++] + 2, *has_equal;
                int i, current_argv_len, match = EOF;

                /* Check to make sure we have not reached a null ('\0') terminator*/
                if (*current_argv == '\0') return EOF;

                /* if our option has a '=' after it (i.e openrpg --roll=5d6)
                then do not count it in our length */
                if ((has_equal = strchr(current_argv, '=')) != NULL) {
                    current_argv_len = has_equal - current_argv;
                    has_equal++;
                } else
                    current_argv_len = strlen(current_argv);

                /* Check if our current option is in our list of longopts */
                for (i = 0; longopts[i].name; i++) {

                    /* Move though the list until we find a match */
                    if (strncmp(current_argv, longopts[i].name, current_argv_len))
                        continue;

                    if (strlen(longopts[i].name) == (unsigned)current_argv_len) {
                        match = i;

                        break;
                    }

                    /* something has gone wrong if we get here*/
                    if (match == EOF) match = i;
                }

                /* if we found a match then lets check if it has an argument */
                if (match != EOF) {
                    /* there could be an arguement! */
                    if (longopts[match].has_arg == required_argument ||
                        longopts[match].has_arg == optional_argument) {

                        /* if there was an equal ('=') then lets move to it
                        otherwise just increment by 1 */
                        if (has_equal)
                            optarg = has_equal;
                        else
                            optarg = argv[optind++];
                    }

                    /* if an argument is required lets make sure we have it*/
                    if ((longopts[match].has_arg == required_argument)
                        && (optarg == NULL)) {
                        /*
                        * Missing argument, leading :
                        * indicates no error should be generated
                        */
                        if ((opterr) && (*optstring != ':'))
                            fprintf(stderr,
                                    "%s: option requires an argument -- %s\n",
                                    program_name(argv[0]),
                                    current_argv);
                        return (((*optstring == ':') ? BADARG : BADCHAR));
                    }
                } else {
                    /* No matching argument */
                    if ((opterr) && (*optstring != ':'))
                        fprintf(stderr,
                                "%s: illegal option -- %s\n",
                                program_name(argv[0]),
                                current_argv);
                    return BADCHAR;
                }

                if (longopts[match].flag) {
                    *longopts[match].flag = longopts[match].val;
                    retval = 0;
                } else
                    retval = longopts[match].val;

                if (index)
                    *index = match;
            }

            return retval;
        }